

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

void highbd_8_variance_sse2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,int w,int h,uint32_t *sse,
               int *sum,high_variance_fn_t var_fn,int block_size)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int sum0;
  uint sse0;
  int j;
  int i;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  *_sse0 = 0;
  *(undefined4 *)CONCAT44(h,i) = 0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < local_24; local_28 = (int)ref + local_28) {
    for (local_2c = 0; local_2c < local_20; local_2c = (int)ref + local_2c) {
      (*(code *)CONCAT44(ref_stride,w))
                (local_8 + (long)(local_c * local_28) * 2 + (long)local_2c * 2,local_c,
                 local_18 + (long)(local_1c * local_28) * 2 + (long)local_2c * 2,local_1c,&local_30,
                 &local_34);
      *_sse0 = local_30 + *_sse0;
      *(int *)CONCAT44(h,i) = local_34 + *(int *)CONCAT44(h,i);
    }
  }
  return;
}

Assistant:

static void highbd_8_variance_sse2(const uint16_t *src, int src_stride,
                                   const uint16_t *ref, int ref_stride, int w,
                                   int h, uint32_t *sse, int *sum,
                                   high_variance_fn_t var_fn, int block_size) {
  int i, j;

  *sse = 0;
  *sum = 0;

  for (i = 0; i < h; i += block_size) {
    for (j = 0; j < w; j += block_size) {
      unsigned int sse0;
      int sum0;
      var_fn(src + src_stride * i + j, src_stride, ref + ref_stride * i + j,
             ref_stride, &sse0, &sum0);
      *sse += sse0;
      *sum += sum0;
    }
  }
}